

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Symbol.cpp
# Opt level: O0

optional<bool> __thiscall slang::ast::Symbol::isDeclaredBefore(Symbol *this,LookupLocation target)

{
  Scope *pSVar1;
  Symbol *symbol;
  Symbol *pSVar2;
  uint32_t in_EDX;
  Scope *in_RSI;
  LookupLocation LVar3;
  Symbol *sym;
  LookupLocation ll;
  bool *in_stack_ffffffffffffff78;
  Symbol *in_stack_ffffffffffffff80;
  __unspec local_74;
  type local_73;
  undefined1 local_72;
  Scope *local_70;
  uint32_t local_68;
  Scope *local_60;
  uint32_t local_58;
  Symbol *local_50;
  __unspec local_43;
  type local_42;
  undefined1 local_41;
  Scope *local_40;
  uint32_t local_38;
  LookupLocation local_30;
  LookupLocation local_18;
  _Optional_payload_base<bool> local_2;
  
  local_18.scope = in_RSI;
  local_18.index = in_EDX;
  LVar3 = LookupLocation::before(in_stack_ffffffffffffff80);
  local_40 = LVar3.scope;
  local_38 = LVar3.index;
  local_30.scope = local_40;
  local_30.index = local_38;
  pSVar1 = LookupLocation::getScope(&local_18);
  if (pSVar1 == (Scope *)0x0) {
    local_42 = (type)LookupLocation::operator<=>(&local_30,&local_18);
    std::__cmp_cat::__unspec::__unspec(&local_43,(__unspec *)0x0);
    local_41 = std::operator<(local_42);
    std::optional<bool>::optional<bool,_true>
              ((optional<bool> *)in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  }
  else {
    do {
      symbol = (Symbol *)LookupLocation::getScope(&local_18);
      pSVar2 = (Symbol *)LookupLocation::getScope(&local_30);
      if (symbol == pSVar2) {
        local_73 = (type)LookupLocation::operator<=>(&local_30,&local_18);
        std::__cmp_cat::__unspec::__unspec(&local_74,(__unspec *)0x0);
        local_72 = std::operator<(local_73);
        std::optional<bool>::optional<bool,_true>
                  ((optional<bool> *)symbol,in_stack_ffffffffffffff78);
        return (optional<bool>)local_2;
      }
      pSVar1 = LookupLocation::getScope(&local_18);
      local_50 = Scope::asSymbol(pSVar1);
      LVar3 = LookupLocation::after(symbol);
      local_70 = LVar3.scope;
      local_68 = LVar3.index;
      local_60 = local_70;
      local_58 = local_68;
      local_18.scope = local_70;
      local_18.index = local_68;
    } while ((local_50->kind != CompilationUnit) &&
            (pSVar1 = LookupLocation::getScope(&local_18), pSVar1 != (Scope *)0x0));
    std::optional<bool>::optional((optional<bool> *)&local_2);
  }
  return (_Optional_base<bool,_true,_true>)(_Optional_base<bool,_true,_true>)local_2;
}

Assistant:

std::optional<bool> Symbol::isDeclaredBefore(LookupLocation target) const {
    LookupLocation ll = LookupLocation::before(*this);
    if (!target.getScope())
        return ll < target;

    // Walk up the target's tree until we find our own scope.
    while (target.getScope() != ll.getScope()) {
        auto& sym = target.getScope()->asSymbol();
        target = LookupLocation::after(sym);
        if (sym.kind == SymbolKind::CompilationUnit || !target.getScope())
            return std::nullopt;
    }

    return ll < target;
}